

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CheckpointBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  vector<duckdb::Value,_true> *this_00;
  pointer pcVar1;
  DatabaseManager *this_01;
  reference pvVar2;
  string *psVar3;
  optional_ptr<duckdb::AttachedDatabase,_true> oVar4;
  BinderException *pBVar5;
  undefined8 *puVar6;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BOOLEAN);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [8])"Success");
  this_01 = DatabaseManager::Get(context);
  this_00 = input->inputs;
  if ((this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar3 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
    oVar4 = DatabaseManager::GetDatabase(this_01,context,psVar3);
  }
  else {
    pvVar2 = vector<duckdb::Value,_true>::operator[](this_00,0);
    if (pvVar2->is_null == true) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Database cannot be NULL","");
      BinderException::BinderException(pBVar5,&local_70);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar2 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    psVar3 = StringValue::Get_abi_cxx11_(pvVar2);
    oVar4 = DatabaseManager::GetDatabase(this_01,context,psVar3);
    if (oVar4.ptr == (AttachedDatabase *)0x0) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Database \"%s\" not found","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (psVar3->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + psVar3->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar5,&local_70,&local_50);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = &PTR__FunctionData_02495148;
  puVar6[1] = oVar4.ptr;
  *(undefined8 **)this = puVar6;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> CheckpointBind(ClientContext &context, TableFunctionBindInput &input,
                                               vector<LogicalType> &return_types, vector<string> &names) {
	return_types.emplace_back(LogicalType::BOOLEAN);
	names.emplace_back("Success");

	optional_ptr<AttachedDatabase> db;
	auto &db_manager = DatabaseManager::Get(context);
	if (!input.inputs.empty()) {
		if (input.inputs[0].IsNull()) {
			throw BinderException("Database cannot be NULL");
		}
		auto &db_name = StringValue::Get(input.inputs[0]);
		db = db_manager.GetDatabase(context, db_name);
		if (!db) {
			throw BinderException("Database \"%s\" not found", db_name);
		}
	} else {
		db = db_manager.GetDatabase(context, DatabaseManager::GetDefaultDatabase(context));
	}
	return make_uniq<CheckpointBindData>(db);
}